

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gla_ManStop(Gla_Man_t *p)

{
  sat_solver2 *psVar1;
  void *__ptr;
  int *__ptr_00;
  int iVar2;
  Vec_Int_t *pVVar3;
  Gia_Man_t *pGVar4;
  Gla_Obj_t *pGVar5;
  long lVar6;
  Gla_Obj_t *pGVar7;
  long lVar8;
  
  if (p->pPars->fVerbose != 0) {
    psVar1 = p->pSat;
    Abc_Print(psVar1->nDBreduces,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n"
              ,(ulong)(uint)psVar1->size,(ulong)(psVar1->stats).clauses,
              (ulong)(uint)(psVar1->stats).conflicts,(ulong)(psVar1->stats).learnts,
              (ulong)(uint)psVar1->nDBreduces,(ulong)(uint)p->nCexes,(ulong)(uint)p->nObjAdded);
  }
  Rnm_ManStop(p->pRnm,0);
  pVVar3 = p->pvRefis;
  if ((pVVar3 != (Vec_Int_t *)0x0) && (pGVar4 = p->pGia, 0 < pGVar4->nObjs)) {
    lVar6 = 8;
    lVar8 = 0;
    do {
      __ptr = *(void **)((long)&pVVar3->nCap + lVar6);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        pVVar3 = p->pvRefis;
        *(undefined8 *)((long)&pVVar3->nCap + lVar6) = 0;
        pGVar4 = p->pGia;
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar8 < pGVar4->nObjs);
  }
  iVar2 = p->nObjs;
  if (1 < iVar2) {
    pGVar5 = p->pObjs;
    pGVar7 = pGVar5 + 1;
    do {
      __ptr_00 = (pGVar7->vFrames).pArray;
      if (__ptr_00 != (int *)0x0) {
        free(__ptr_00);
        (pGVar7->vFrames).pArray = (int *)0x0;
        pGVar5 = p->pObjs;
        iVar2 = p->nObjs;
      }
      pGVar7 = pGVar7 + 1;
    } while (pGVar7 < pGVar5 + iVar2);
  }
  Cnf_DataFree(p->pCnf);
  if (p->pGia0 != (Gia_Man_t *)0x0) {
    Gia_ManStop(p->pGia);
  }
  sat_solver2_delete(p->pSat);
  pVVar3 = p->vObjCounts;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vObjCounts->pArray = (int *)0x0;
      pVVar3 = p->vObjCounts;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0060b7a1;
    }
    free(pVVar3);
    p->vObjCounts = (Vec_Int_t *)0x0;
  }
LAB_0060b7a1:
  pVVar3 = p->vAddedNew;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vAddedNew->pArray = (int *)0x0;
      pVVar3 = p->vAddedNew;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0060b7dd;
    }
    free(pVVar3);
    p->vAddedNew = (Vec_Int_t *)0x0;
  }
LAB_0060b7dd:
  pVVar3 = p->vCoreCounts;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vCoreCounts->pArray = (int *)0x0;
      pVVar3 = p->vCoreCounts;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0060b819;
    }
    free(pVVar3);
    p->vCoreCounts = (Vec_Int_t *)0x0;
  }
LAB_0060b819:
  pVVar3 = p->vProofIds;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vProofIds->pArray = (int *)0x0;
      pVVar3 = p->vProofIds;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0060b861;
    }
    free(pVVar3);
    p->vProofIds = (Vec_Int_t *)0x0;
  }
LAB_0060b861:
  pVVar3 = p->vTemp;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vTemp->pArray = (int *)0x0;
      pVVar3 = p->vTemp;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0060b89d;
    }
    free(pVVar3);
    p->vTemp = (Vec_Int_t *)0x0;
  }
LAB_0060b89d:
  pVVar3 = p->vAbs;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    if (pVVar3->pArray != (int *)0x0) {
      free(pVVar3->pArray);
      p->vAbs->pArray = (int *)0x0;
      pVVar3 = p->vAbs;
      if (pVVar3 == (Vec_Int_t *)0x0) goto LAB_0060b8d9;
    }
    free(pVVar3);
    p->vAbs = (Vec_Int_t *)0x0;
  }
LAB_0060b8d9:
  if (p->pvRefis != (Vec_Int_t *)0x0) {
    free(p->pvRefis);
    p->pvRefis = (Vec_Int_t *)0x0;
  }
  if (p->pObj2Obj != (uint *)0x0) {
    free(p->pObj2Obj);
    p->pObj2Obj = (uint *)0x0;
  }
  if (p->pObjs != (Gla_Obj_t *)0x0) {
    free(p->pObjs);
  }
  free(p);
  return;
}

Assistant:

void Gla_ManStop( Gla_Man_t * p )
{
    Gla_Obj_t * pGla;
    int i;

    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), sat_solver2_nconflicts(p->pSat), 
            sat_solver2_nlearnts(p->pSat), p->pSat->nDBreduces, p->nCexes, p->nObjAdded );

    // stop the refinement manager
//    Gia_ManStopP( &p->pGia2 );
    Rnm_ManStop( p->pRnm, 0 );

    if ( p->pvRefis )
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
        ABC_FREE( p->pvRefis[i].pArray );
    Gla_ManForEachObj( p, pGla )
        ABC_FREE( pGla->vFrames.pArray );
    Cnf_DataFree( p->pCnf );
    if ( p->pGia0 != NULL )
        Gia_ManStop( p->pGia );
//    Gia_ManStaticFanoutStart( p->pGia0 );
    sat_solver2_delete( p->pSat );
    Vec_IntFreeP( &p->vObjCounts );
    Vec_IntFreeP( &p->vAddedNew );
    Vec_IntFreeP( &p->vCoreCounts );
    Vec_IntFreeP( &p->vProofIds );
    Vec_IntFreeP( &p->vTemp );
    Vec_IntFreeP( &p->vAbs );
    ABC_FREE( p->pvRefis );
    ABC_FREE( p->pObj2Obj );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}